

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTiming.cc
# Opt level: O0

int main(void)

{
  rep_conflict rVar1;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  ostream *poVar2;
  int i_1;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  int i;
  time_point start;
  int ncalls;
  vector<double,_std::allocator<double>_> x;
  FeedForwardNN<double> nn;
  vector<int,_std::allocator<int>_> arch;
  nullptr_t in_stack_fffffffffffffb98;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *in_stack_fffffffffffffba0;
  FeedForwardNN<double> *this;
  _func_double_double_ptr *in_stack_fffffffffffffba8;
  Preprocessing *Preproc;
  function<double_(const_double_&)> *in_stack_fffffffffffffbb0;
  OutputFunction *in_stack_fffffffffffffbb8;
  int *in_stack_fffffffffffffbc0;
  allocator_type *in_stack_fffffffffffffbc8;
  FeedForwardNN<double> *in_stack_fffffffffffffbd0;
  iterator in_stack_fffffffffffffbd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffbe0;
  function<double_(const_double_&)> *in_stack_fffffffffffffbe8;
  function<double_(const_double_&)> *in_stack_fffffffffffffbf0;
  int local_37c;
  duration<double,_std::ratio<1L,_1L>_> local_360 [4];
  int local_33c;
  undefined8 local_338;
  undefined4 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 *local_310;
  undefined8 local_308;
  Preprocessing local_2e8 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined1 local_269;
  undefined4 local_268;
  undefined4 local_264;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda0;
  FeedForwardNN<double> *in_stack_fffffffffffffda8;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 *local_30;
  undefined8 local_28;
  int local_4;
  
  local_4 = 0;
  local_40 = 3;
  local_3c = 5;
  local_38 = 5;
  local_34 = 3;
  local_30 = &local_40;
  local_28 = 4;
  std::allocator<int>::allocator((allocator<int> *)0x10254f);
  __l._M_len = (size_type)in_stack_fffffffffffffbe0;
  __l._M_array = (iterator)in_stack_fffffffffffffbd8;
  std::vector<int,_std::allocator<int>_>::vector
            (&in_stack_fffffffffffffbd0->_Arch,__l,(allocator_type *)in_stack_fffffffffffffbc8);
  std::allocator<int>::~allocator((allocator<int> *)0x102583);
  local_264 = 0;
  local_268 = 0;
  local_269 = 1;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_298 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1025e6);
  this = (FeedForwardNN<double> *)(local_2e8 + 1);
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  Preproc = local_2e8;
  std::function<double(double_const&)>::function<double(&)(double_const&),void>
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  nnad::FeedForwardNN<double>::FeedForwardNN
            (in_stack_fffffffffffffbd0,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc8,
             in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(bool *)in_stack_fffffffffffffbb0,
             Preproc,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbf0);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102688);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x102695);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0);
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::~function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
               *)0x1026af);
  local_318 = 0x4012000000000000;
  local_328 = 0x3fb999999999999a;
  uStack_320 = 0x4002666666666666;
  local_310 = &local_328;
  local_308 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x102701);
  __l_00._M_len = (size_type)in_stack_fffffffffffffbe0;
  __l_00._M_array = in_stack_fffffffffffffbd8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbd0,__l_00,
             in_stack_fffffffffffffbc8);
  std::allocator<double>::~allocator((allocator<double> *)0x102735);
  local_330 = 500000;
  local_338 = std::chrono::_V2::steady_clock::now();
  for (local_33c = 0; local_33c < 500000; local_33c = local_33c + 1) {
    nnad::FeedForwardNN<double>::Evaluate(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0);
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)Preproc,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)this);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbb0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)Preproc);
  poVar2 = std::operator<<((ostream *)&std::cout,"Time elepsed taken for ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,500000);
  poVar2 = std::operator<<(poVar2," evaluations of the NN: ");
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_360);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar1);
  poVar2 = std::operator<<(poVar2," seconds");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_338 = std::chrono::_V2::steady_clock::now();
  for (local_37c = 0; local_37c < 500000; local_37c = local_37c + 1) {
    nnad::FeedForwardNN<double>::Derive
              ((FeedForwardNN<double> *)nn._Links._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
               ,(vector<double,_std::allocator<double>_> *)nn._Links._M_t._M_impl._0_8_);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0);
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)Preproc,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)this);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffbb0,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)Preproc);
  poVar2 = std::operator<<((ostream *)&std::cout,"Time elepsed taken for ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,500000);
  poVar2 = std::operator<<(poVar2," evaluations of the NN and its derivatives: ");
  rVar1 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(local_360);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar1);
  poVar2 = std::operator<<(poVar2," seconds\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)poVar2);
  nnad::FeedForwardNN<double>::~FeedForwardNN(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)poVar2);
  return local_4;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{3, 5, 5, 3};

  // Initialise NN
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::ACTIVATION, true};

  // Input vector
  std::vector<double> x{0.1, 2.3, 4.5};

  // Number of calls
  const int ncalls = 500000;

  // Start timer
  auto start{std::chrono::steady_clock::now()};

  // Get NN at x
  for (int i = 0; i < ncalls; i++)
    nn.Evaluate(x);

  // Stop timer
  std::chrono::duration<double> elapsed_seconds{std::chrono::steady_clock::now() - start};

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN: " << elapsed_seconds.count() << " seconds" << std::endl;

  // Start timer
  start = std::chrono::steady_clock::now();

  // Compare NN derivatives at x
  for (int i = 0; i < ncalls; i++)
    nn.Derive(x);

  // Stop timer
  elapsed_seconds = std::chrono::steady_clock::now() - start;

  // Report time
  std::cout << "Time elepsed taken for " << ncalls << " evaluations of the NN and its derivatives: " << elapsed_seconds.count() << " seconds\n" << std::endl;

  return 0;
}